

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

rnndomain * rnn_finddomain(rnndb *db,char *name)

{
  int iVar1;
  rnndomain **pprVar2;
  rnndomain *prVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = db->domainsnum;
  if (0 < (long)iVar1) {
    pprVar2 = db->domains;
    lVar5 = 0;
    do {
      prVar3 = pprVar2[lVar5];
      iVar4 = strcmp(prVar3->name,name);
      if (iVar4 == 0) {
        return prVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return (rnndomain *)0x0;
}

Assistant:

struct rnndomain *rnn_finddomain (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->domainsnum; i++)
		if (!strcmp(db->domains[i]->name, name))
			return db->domains[i];
	return 0;
}